

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::config::load_config_file(config *this,string *config_path)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  iterator __first;
  iterator __last;
  ostream *poVar8;
  runtime_error *this_00;
  disk_list_type *this_01;
  string local_490 [32];
  ostringstream local_470 [8];
  ostringstream msg;
  __normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_2e0;
  const_iterator local_2d8;
  undefined1 local_2d0 [8];
  disk_config entry;
  string line;
  long local_238;
  ifstream cfg_file;
  undefined1 local_30 [8];
  vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> flash_list;
  string *config_path_local;
  config *this_local;
  
  flash_list.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config_path;
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::vector
            ((vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> *)local_30);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_238,uVar3,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&entry.queue_length);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,(string *)&entry.queue_length);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      lVar5 = std::__cxx11::string::size();
      if ((lVar5 != 0) &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&entry.queue_length),
         *pcVar6 != '#')) {
        disk_config::disk_config((disk_config *)local_2d0);
        disk_config::parse_line((disk_config *)local_2d0,(string *)&entry.queue_length);
        if ((entry.autogrow & 1U) == 0) {
          std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::push_back
                    (&this->disks_list,(value_type *)local_2d0);
        }
        else {
          std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::push_back
                    ((vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> *)local_30,
                     (value_type *)local_2d0);
        }
        disk_config::~disk_config((disk_config *)local_2d0);
      }
    }
    std::ifstream::close();
    this_01 = &this->disks_list;
    sVar7 = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::size(this_01);
    this->first_flash = (uint)sVar7;
    local_2e0._M_current =
         (disk_config *)
         std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::end(this_01);
    __gnu_cxx::
    __normal_iterator<foxxll::disk_config_const*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>
    ::__normal_iterator<foxxll::disk_config*>
              ((__normal_iterator<foxxll::disk_config_const*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>
                *)&local_2d8,&local_2e0);
    __first = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::begin
                        ((vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> *)
                         local_30);
    __last = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::end
                       ((vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> *)
                        local_30);
    std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>::
    insert<__gnu_cxx::__normal_iterator<foxxll::disk_config*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>,void>
              ((vector<foxxll::disk_config,std::allocator<foxxll::disk_config>> *)this_01,local_2d8,
               (__normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
                )__first._M_current,
               (__normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
                )__last._M_current);
    bVar2 = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::empty
                      (&this->disks_list);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_470);
      poVar8 = std::operator<<((ostream *)local_470,"Error in ");
      poVar8 = std::operator<<(poVar8,
                               "virtual void foxxll::config::load_config_file(const std::string &)")
      ;
      poVar8 = std::operator<<(poVar8," : ");
      poVar8 = std::operator<<(poVar8,"No disks found in \'");
      poVar8 = std::operator<<(poVar8,(string *)
                                      flash_list.
                                      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar8,"\'.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_490);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&entry.queue_length);
  }
  else {
    (*this->_vptr_config[5])();
  }
  std::ifstream::~ifstream(&local_238);
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector
            ((vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> *)local_30);
  return;
}

Assistant:

void config::load_config_file(const std::string& config_path)
{
    std::vector<disk_config> flash_list;
    std::ifstream cfg_file(config_path.c_str());

    if (!cfg_file)
        return load_default_config();

    std::string line;

    while (std::getline(cfg_file, line))
    {
        // skip comments
        if (line.size() == 0 || line[0] == '#') continue;

        disk_config entry;
        entry.parse_line(line); // throws on errors

        if (!entry.flash)
            disks_list.push_back(entry);
        else
            flash_list.push_back(entry);
    }
    cfg_file.close();

    // put flash devices after regular disks
    first_flash = static_cast<unsigned int>(disks_list.size());
    disks_list.insert(disks_list.end(), flash_list.begin(), flash_list.end());

    if (disks_list.empty()) {
        FOXXLL_THROW(
            std::runtime_error,
            "No disks found in '" << config_path << "'."
        );
    }
}